

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLStringRefTest_ConstructFromCStringAndSize_Test::TestBody
          (NLStringRefTest_ConstructFromCStringAndSize_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  AssertHelper *this_00;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  NLStringRef s;
  char *data;
  AssertHelper *in_stack_fffffffffffffe80;
  char **in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  NLStringRef *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  Type in_stack_fffffffffffffeac;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  AssertionResult *this_02;
  undefined7 in_stack_ffffffffffffff00;
  allocator<char> local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_t local_78;
  undefined4 local_6c;
  AssertionResult local_68 [3];
  char *local_38;
  AssertionResult local_30;
  NLStringRef local_20;
  char *local_10;
  
  local_10 = "foo";
  mp::NLStringRef::NLStringRef
            (in_stack_fffffffffffffea0,
             (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (size_t)in_stack_fffffffffffffe90);
  local_38 = mp::NLStringRef::c_str(&local_20);
  this_02 = &local_30;
  testing::internal::EqHelper<false>::Compare<char_const*,char_const*>
            ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(char **)in_stack_fffffffffffffe80)
  ;
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x13a61f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
               ,in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),(Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x13a67c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a6d1);
  local_6c = 7;
  local_78 = mp::NLStringRef::size(&local_20);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90,(uint *)in_stack_fffffffffffffe88,
             (unsigned_long *)in_stack_fffffffffffffe80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x13a787);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
               ,in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),(Message *)this_02);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x13a7e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a83c);
  this_01 = &local_98;
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)this_01);
  if (bVar2) {
    __s = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__s,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::allocator<char>::~allocator(&local_b9);
    in_stack_fffffffffffffeb7 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffeb7) {
      mp::NLStringRef::NLStringRef
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (size_t)in_stack_fffffffffffffe90);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (char (*) [111])CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::__cxx11::string::~string(local_b8);
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13aba7);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
             in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),(Message *)this_02);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x13ac04);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ac59);
  return;
}

Assistant:

TEST(NLStringRefTest, ConstructFromCStringAndSize) {
  const char *data = "foo\0bar";
  const mp::NLStringRef s(data, 7);
  EXPECT_EQ(data, s.c_str());
  EXPECT_EQ(7u, s.size());
  EXPECT_ASSERT(mp::NLStringRef("foo", 2), "string not null-terminated");
}